

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highfreqclasses.cpp
# Opt level: O3

void __thiscall SpikesConsumer::initialize(SpikesConsumer *this)

{
  void *pvVar1;
  long lVar2;
  ulong uVar3;
  
  zsock_set_unsubscribe((this->super_HFSubConsumer).super_HighFreqSub.sub,"");
  if ((this->args).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->args).indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      pvVar1 = zsock_resolve((this->super_HFSubConsumer).super_HighFreqSub.sub);
      zmq_setsockopt(pvVar1,6,(long)(this->args).indices.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start + lVar2,8);
      uVar3 = uVar3 + 2;
      lVar2 = lVar2 + 8;
    } while (uVar3 < (ulong)((long)(this->args).indices.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)(this->args).indices.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start >> 2));
  }
  HFSubConsumer::initialize(&this->super_HFSubConsumer);
  return;
}

Assistant:

void SpikesConsumer::initialize(){
    zsock_set_unsubscribe(sub, "");
    for(size_t i = 0; i < args.indices.size(); i+=2){
        zmq_setsockopt(zsock_resolve(sub), ZMQ_SUBSCRIBE, &args.indices[i], 2*sizeof(int));
    }
    HFSubConsumer::initialize();
}